

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<long>::Decompose_Cholesky(TPZMatrix<long> *this)

{
  _func_int *p_Var1;
  undefined1 auVar2 [16];
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  int64_t k;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  long local_58;
  long tmp;
  long local_48;
  long local_40;
  long local_38;
  
  cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar3 != '\0') && (cVar3 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar3 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_38 = CONCAT44(extraout_var,iVar4);
    lVar7 = 0;
    local_48 = 0;
    if (local_38 != 0 && -1 < extraout_var) {
      local_48 = local_38;
    }
    while (lVar9 = lVar7, lVar9 != local_48) {
      for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 1) {
        iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar9,lVar7);
        iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar9,lVar7);
        iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar9,lVar9);
        tmp = CONCAT44(extraout_var_02,iVar6) -
              CONCAT44(extraout_var_01,iVar5) * CONCAT44(extraout_var_00,iVar4);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar9,lVar9,&tmp);
      }
      iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar9,lVar9);
      dVar10 = (double)CONCAT44(extraout_var_03,iVar4);
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      tmp = (long)dVar10;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar9,lVar9,&tmp);
      lVar8 = lVar9 + 1;
      local_40 = lVar8;
      for (; lVar7 = local_40, lVar8 < local_38; lVar8 = lVar8 + 1) {
        for (lVar7 = 0; p_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24]
            , lVar9 != lVar7; lVar7 = lVar7 + 1) {
          iVar4 = (*p_Var1)(this,lVar9,lVar7);
          iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar8,lVar7);
          iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar9,lVar8);
          local_58 = CONCAT44(extraout_var_06,iVar6) -
                     CONCAT44(extraout_var_05,iVar5) * CONCAT44(extraout_var_04,iVar4);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar9,lVar8,&local_58);
        }
        iVar4 = (*p_Var1)(this,lVar9,lVar9);
        if (CONCAT44(extraout_var_07,iVar4) == 0) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar9,lVar8);
        auVar2._4_4_ = extraout_var_08;
        auVar2._0_4_ = iVar4;
        iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar9,lVar9);
        auVar2._8_8_ = (long)extraout_var_08 >> 0x1f;
        local_58 = SUB168(auVar2 / SEXT816(CONCAT44(extraout_var_09,iVar4)),0);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar9,lVar8,&local_58);
        iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar9,lVar8);
        local_58 = CONCAT44(extraout_var_10,iVar4);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar8,lVar9,&local_58);
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}